

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateBufferHasIdentifier
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  long lVar1;
  anon_class_16_2_10fcf984 local_120;
  function<void_()> local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  string name;
  undefined1 local_48 [8];
  string file_identifier;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinKMPGenerator *this_local;
  
  file_identifier.field_2._8_8_ = options;
  std::__cxx11::string::string
            ((string *)local_48,(string *)&((this->super_BaseGenerator).parser_)->file_identifier_);
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ == struct_def) {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0) {
      IdlNamer::Function_abi_cxx11_((string *)local_70,&this->namer_,&struct_def->super_Definition);
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "BufferHasIdentifier");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"buffer: ReadWriteBuffer",&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Boolean",&local_e9);
      local_120.file_identifier = (string *)local_48;
      local_120.writer = writer;
      std::function<void()>::
      function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateBufferHasIdentifier(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
                ((function<void()> *)&local_110,&local_120);
      GenerateFunOneLine(writer,&local_a0,&local_c0,&local_e8,&local_110,
                         (bool)(options->gen_jvmstatic & 1));
      std::function<void_()>::~function(&local_110);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)local_70);
      name.field_2._12_4_ = 0;
      goto LAB_0027bed1;
    }
  }
  name.field_2._12_4_ = 1;
LAB_0027bed1:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GenerateBufferHasIdentifier(StructDef &struct_def, CodeWriter &writer,
                                   IDLOptions options) const {
    auto file_identifier = parser_.file_identifier_;
    // Check if a buffer has the identifier.
    if (parser_.root_struct_def_ != &struct_def || !file_identifier.length())
      return;
    auto name = namer_.Function(struct_def);
    GenerateFunOneLine(
        writer, name + "BufferHasIdentifier", "buffer: ReadWriteBuffer",
        "Boolean",
        [&]() {
          writer += "hasIdentifier(buffer, \"" + file_identifier + "\")";
        },
        options.gen_jvmstatic);
  }